

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O0

void SocketManager::print(void)

{
  int i;
  ll tot_recv;
  ll tot_send;
  int local_14;
  long local_10;
  long local_8;
  
  local_8 = 0;
  local_10 = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    if (node_type != local_14) {
      local_8 = socket_io[node_type][local_14]->send_num + local_8;
      local_10 = socket_io[node_type][local_14]->recv_num + local_10;
    }
  }
  printf("tot_send: %lld tot_recv: %lld\n",local_8,local_10);
  return;
}

Assistant:

void SocketManager::print() {
    ll tot_send = 0, tot_recv = 0;
    for (int i = 0; i < M; i++) {
        if (node_type != i) {
            tot_send += socket_io[node_type][i]->send_num;
            tot_recv += socket_io[node_type][i]->recv_num;
        }
    }
    DBGprint("tot_send: %lld tot_recv: %lld\n", tot_send, tot_recv);
}